

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O0

bool __thiscall
sentencepiece::filesystem::PosixReadableFile::ReadAll(PosixReadableFile *this,string *line)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  long in_RDI;
  char *in_stack_ffffffffffffff58;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffff60;
  istream_type *in_stack_ffffffffffffff68;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_ffffffffffffffb8;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_ffffffffffffffc8;
  Die local_19 [24];
  bool local_1;
  
  if (*(undefined8 **)(in_RDI + 0x10) == &std::cin) {
    iVar1 = logging::GetMinLogLevel();
    if (iVar1 < 3) {
      error::Die::Die(local_19,false);
      pcVar2 = logging::BaseName(in_stack_ffffffffffffff58);
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x39);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"LOG(");
      poVar3 = std::operator<<(poVar3,"ERROR");
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"ReadAll is not supported for stdin.");
      error::Die::operator&(local_19,poVar3);
      error::Die::~Die((Die *)poVar3);
    }
    local_1 = false;
  }
  else {
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
              (in_stack_ffffffffffffff60);
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffb8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ReadAll(std::string *line) {
    if (is_ == &std::cin) {
      LOG(ERROR) << "ReadAll is not supported for stdin.";
      return false;
    }
    line->assign(std::istreambuf_iterator<char>(*is_),
                 std::istreambuf_iterator<char>());
    return true;
  }